

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcElectricGeneratorType::~IfcElectricGeneratorType
          (IfcElectricGeneratorType *this)

{
  ~IfcElectricGeneratorType
            ((IfcElectricGeneratorType *)
             &this[-1].super_IfcEnergyConversionDeviceType.super_IfcDistributionFlowElementType.
              super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.
              super_IfcTypeObject.field_0x48);
  return;
}

Assistant:

IfcElectricGeneratorType() : Object("IfcElectricGeneratorType") {}